

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::
     IntegerBinaryCastLoop<duckdb::IntegerCastData<long>,false,false,duckdb::IntegerCastOperation>
               (char *buf,idx_t len,IntegerCastData<long> *result,bool strict)

{
  char cVar1;
  bool bVar2;
  IntegerCastData<long> *in_RDX;
  IntegerCastData<long> *in_RSI;
  long in_RDI;
  char current_char;
  uint8_t digit;
  idx_t pos;
  idx_t start_pos;
  uint8_t digit_00;
  IntegerCastData<long> *state;
  IntegerCastData<long> *pIVar3;
  
  pIVar3 = (IntegerCastData<long> *)0x1;
  while( true ) {
    if (in_RSI <= pIVar3) {
      bVar2 = IntegerCastOperation::Finalize<duckdb::IntegerCastData<long>,false>(in_RDX);
      if (!bVar2) {
        return false;
      }
      return (IntegerCastData<long> *)0x1 < pIVar3;
    }
    cVar1 = *(char *)((long)&pIVar3->result + in_RDI);
    if (cVar1 == '0') {
      digit_00 = '\0';
    }
    else {
      if (cVar1 != '1') {
        return false;
      }
      digit_00 = '\x01';
    }
    state = (IntegerCastData<long> *)((long)&pIVar3->result + 1);
    if (((state != in_RSI) && (*(char *)((long)&state->result + in_RDI) == '_')) &&
       ((state = (IntegerCastData<long> *)((long)&pIVar3->result + 2), state == in_RSI ||
        ((*(char *)((long)&state->result + in_RDI) != '0' &&
         (*(char *)((long)&state->result + in_RDI) != '1')))))) break;
    bVar2 = IntegerCastOperation::HandleBinaryDigit<duckdb::IntegerCastData<long>,false>
                      (state,digit_00);
    pIVar3 = state;
    if (!bVar2) {
      return false;
    }
  }
  return false;
}

Assistant:

static bool IntegerBinaryCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	if (ALLOW_EXPONENT || NEGATIVE) {
		return false;
	}
	idx_t start_pos = 1;
	idx_t pos = start_pos;
	uint8_t digit;
	char current_char;
	while (pos < len) {
		current_char = buf[pos];
		if (current_char == '0') {
			digit = 0;
		} else if (current_char == '1') {
			digit = 1;
		} else {
			return false;
		}
		pos++;
		if (pos != len && buf[pos] == '_') {
			// Skip one underscore if it is not the last character and followed by a digit
			pos++;
			if (pos == len || (buf[pos] != '0' && buf[pos] != '1')) {
				return false;
			}
		}

		if (!OP::template HandleBinaryDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}